

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

string * relive::heuristicUtf8(string *__return_storage_ptr__,string *str)

{
  bool bVar1;
  byte *pbVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string *str_local;
  string *result;
  
  bVar1 = ghc::filesystem::detail::validUtf8(str);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::size();
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    __end2._M_current = (char *)std::__cxx11::string::begin();
    _Stack_48._M_current = (char *)std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb8), bVar1) {
      pbVar2 = (byte *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&__end2);
      ghc::filesystem::detail::appendUTF8(__return_storage_ptr__,(uint)*pbVar2);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string heuristicUtf8(const std::string& str)
{
    if(fs::detail::validUtf8(str)) {
        return str;
    }
    else {
        std::string result;
        result.reserve(str.size());
        for(char c : str) {
            fs::detail::appendUTF8(result, static_cast<uint8_t>(c));
        }
        return result;
    }
}